

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
duckdb::Connection::CreateScalarFunction<double,double,double,double>
          (Connection *this,string *name,vector<duckdb::LogicalType,_true> *args,
          LogicalType *ret_type,_func_double_double_double_double *udf_func)

{
  type pCVar1;
  _func_double_double_double_double *in_R9;
  scalar_function_t function;
  LogicalType aLStack_c8 [24];
  LogicalType local_b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_80;
  string local_60 [32];
  scalar_function_t local_40;
  
  UDFWrapper::CreateScalarFunction<double,double,double,double>
            (&local_40,(UDFWrapper *)name,(string *)args,
             (vector<duckdb::LogicalType,_true> *)ret_type,(LogicalType *)udf_func,in_R9);
  std::__cxx11::string::string(local_60,(string *)name);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_98,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  duckdb::LogicalType::LogicalType(local_b0,ret_type);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (&local_80,&local_40);
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(aLStack_c8,INVALID);
  duckdb::UDFWrapper::RegisterFunction(local_60,&local_98,local_b0,&local_80,pCVar1,aLStack_c8);
  duckdb::LogicalType::~LogicalType(aLStack_c8);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_80);
  duckdb::LogicalType::~LogicalType(local_b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  std::__cxx11::string::~string(local_60);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

void CreateScalarFunction(const string &name, vector<LogicalType> args, LogicalType ret_type,
	                          TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		UDFWrapper::RegisterFunction(name, args, ret_type, function, *context);
	}